

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createBinaryMatrixOperation
          (TGlslangToSpvTraverser *this,Op op,OpDecorations *decorations,Id typeId,Id left,Id right)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Id left_00;
  Id IVar4;
  uint uVar5;
  Id local_dc;
  Id local_d8;
  uint local_d4;
  Id local_a0;
  Id result_1;
  Id local_98;
  Id result_2;
  Id rightVec;
  Id leftVec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint c;
  Id smearVec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  Id vecType;
  Id scalarType;
  int numRows;
  uint numCols;
  bool rightMat;
  bool leftMat;
  Id result;
  Id resultType;
  Id IStack_30;
  bool firstClass;
  Id right_local;
  Id left_local;
  Id typeId_local;
  OpDecorations *decorations_local;
  TGlslangToSpvTraverser *pTStack_18;
  Op op_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar2 = true;
  resultType = right;
  IStack_30 = left;
  right_local = typeId;
  _left_local = decorations;
  decorations_local._4_4_ = op;
  pTStack_18 = this;
  switch(op) {
  case OpFDiv:
    bVar1 = spv::Builder::isMatrix(&this->builder,left);
    if ((bVar1) && (bVar1 = spv::Builder::isScalar(&this->builder,resultType), bVar1)) {
      IVar4 = spv::Builder::getTypeId(&this->builder,resultType);
      left_00 = spv::Builder::makeFpConstant(&this->builder,IVar4,1.0,false);
      resultType = spv::Builder::createBinOp(&this->builder,OpFDiv,IVar4,left_00,resultType);
      decorations_local._4_4_ = OpMatrixTimesScalar;
    }
    else {
      bVar2 = false;
    }
    break;
  default:
    bVar2 = false;
    break;
  case OpMatrixTimesScalar:
    bVar1 = spv::Builder::isMatrix(&this->builder,right);
    if ((bVar1) || (bVar1 = spv::Builder::isCooperativeMatrix(&this->builder,resultType), bVar1)) {
      std::swap<unsigned_int>(&stack0xffffffffffffffd0,&resultType);
    }
    bVar1 = spv::Builder::isScalar(&this->builder,resultType);
    if (!bVar1) {
      __assert_fail("builder.isScalar(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cbd,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    break;
  case OpVectorTimesMatrix:
    bVar1 = spv::Builder::isVector(&this->builder,left);
    if (!bVar1) {
      __assert_fail("builder.isVector(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc0,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    bVar1 = spv::Builder::isMatrix(&this->builder,resultType);
    if (!bVar1) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    break;
  case OpMatrixTimesVector:
    bVar1 = spv::Builder::isMatrix(&this->builder,left);
    if (!bVar1) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc4,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    bVar1 = spv::Builder::isVector(&this->builder,resultType);
    if (!bVar1) {
      __assert_fail("builder.isVector(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc5,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    break;
  case OpMatrixTimesMatrix:
    bVar1 = spv::Builder::isMatrix(&this->builder,left);
    if (!bVar1) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc8,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    bVar1 = spv::Builder::isMatrix(&this->builder,resultType);
    if (!bVar1) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc9,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
  }
  bVar1 = spv::Builder::isCooperativeMatrix(&this->builder,IStack_30);
  if ((bVar1) || (bVar1 = spv::Builder::isCooperativeMatrix(&this->builder,resultType), bVar1)) {
    bVar2 = true;
  }
  if (bVar2) {
    IVar4 = spv::Builder::createBinOp
                      (&this->builder,decorations_local._4_4_,right_local,IStack_30,resultType);
    anon_unknown_0::OpDecorations::addNoContraction(_left_local,&this->builder,IVar4);
    anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,IVar4);
    this_local._4_4_ = spv::Builder::setPrecision(&this->builder,IVar4,_left_local->precision);
  }
  else {
    if ((((decorations_local._4_4_ != OpFAdd) && (decorations_local._4_4_ != OpFSub)) &&
        (decorations_local._4_4_ != OpFMul)) &&
       ((decorations_local._4_4_ != OpFDiv && (decorations_local._4_4_ != OpFMod)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1d08,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    bVar2 = spv::Builder::isMatrix(&this->builder,IStack_30);
    bVar1 = spv::Builder::isMatrix(&this->builder,resultType);
    if (bVar2) {
      uVar5 = spv::Builder::getNumColumns(&this->builder,IStack_30);
      local_d4 = spv::Builder::getNumRows(&this->builder,IStack_30);
    }
    else {
      uVar5 = spv::Builder::getNumColumns(&this->builder,resultType);
      local_d4 = spv::Builder::getNumRows(&this->builder,resultType);
    }
    IVar4 = spv::Builder::getScalarTypeId(&this->builder,right_local);
    results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::makeVectorType(&this->builder,IVar4,local_d4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&c);
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bVar3 = spv::Builder::isScalar(&this->builder,IStack_30);
    if (bVar3) {
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           spv::Builder::smearScalar
                     (&this->builder,_left_local->precision,IStack_30,
                      results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    }
    else {
      bVar3 = spv::Builder::isScalar(&this->builder,resultType);
      if (bVar3) {
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             spv::Builder::smearScalar
                       (&this->builder,_left_local->precision,resultType,
                        results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      }
    }
    for (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < uVar5;
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rightVec);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rightVec,
                 (value_type *)
                 &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        local_d8 = spv::Builder::createCompositeExtract
                             (&this->builder,IStack_30,
                              results.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rightVec);
      }
      else {
        local_d8 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      result_2 = local_d8;
      if (bVar1) {
        local_dc = spv::Builder::createCompositeExtract
                             (&this->builder,resultType,
                              results.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rightVec);
      }
      else {
        local_dc = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      local_98 = local_dc;
      result_1 = spv::Builder::createBinOp
                           (&this->builder,decorations_local._4_4_,
                            results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,result_2,
                            local_dc);
      anon_unknown_0::OpDecorations::addNoContraction(_left_local,&this->builder,result_1);
      anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,result_1);
      local_a0 = spv::Builder::setPrecision(&this->builder,result_1,_left_local->precision);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&c,&local_a0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rightVec);
    }
    IVar4 = spv::Builder::createCompositeConstruct
                      (&this->builder,right_local,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&c);
    IVar4 = spv::Builder::setPrecision(&this->builder,IVar4,_left_local->precision);
    anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,IVar4);
    this_local._4_4_ = IVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&c);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op op, OpDecorations& decorations, spv::Id typeId,
                                                            spv::Id left, spv::Id right)
{
    bool firstClass = true;

    // First, handle first-class matrix operations (* and matrix/scalar)
    switch (op) {
    case spv::OpFDiv:
        if (builder.isMatrix(left) && builder.isScalar(right)) {
            // turn matrix / scalar into a multiply...
            spv::Id resultType = builder.getTypeId(right);
            right = builder.createBinOp(spv::OpFDiv, resultType, builder.makeFpConstant(resultType, 1.0), right);
            op = spv::OpMatrixTimesScalar;
        } else
            firstClass = false;
        break;
    case spv::OpMatrixTimesScalar:
        if (builder.isMatrix(right) || builder.isCooperativeMatrix(right))
            std::swap(left, right);
        assert(builder.isScalar(right));
        break;
    case spv::OpVectorTimesMatrix:
        assert(builder.isVector(left));
        assert(builder.isMatrix(right));
        break;
    case spv::OpMatrixTimesVector:
        assert(builder.isMatrix(left));
        assert(builder.isVector(right));
        break;
    case spv::OpMatrixTimesMatrix:
        assert(builder.isMatrix(left));
        assert(builder.isMatrix(right));
        break;
    default:
        firstClass = false;
        break;
    }

    if (builder.isCooperativeMatrix(left) || builder.isCooperativeMatrix(right))
        firstClass = true;

    if (firstClass) {
        spv::Id result = builder.createBinOp(op, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    // Handle component-wise +, -, *, %, and / for all combinations of type.
    // The result type of all of them is the same type as the (a) matrix operand.
    // The algorithm is to:
    //   - break the matrix(es) into vectors
    //   - smear any scalar to a vector
    //   - do vector operations
    //   - make a matrix out the vector results
    switch (op) {
    case spv::OpFAdd:
    case spv::OpFSub:
    case spv::OpFDiv:
    case spv::OpFMod:
    case spv::OpFMul:
    {
        // one time set up...
        bool  leftMat = builder.isMatrix(left);
        bool rightMat = builder.isMatrix(right);
        unsigned int numCols = leftMat ? builder.getNumColumns(left) : builder.getNumColumns(right);
        int numRows = leftMat ? builder.getNumRows(left) : builder.getNumRows(right);
        spv::Id scalarType = builder.getScalarTypeId(typeId);
        spv::Id vecType = builder.makeVectorType(scalarType, numRows);
        std::vector<spv::Id> results;
        spv::Id smearVec = spv::NoResult;
        if (builder.isScalar(left))
            smearVec = builder.smearScalar(decorations.precision, left, vecType);
        else if (builder.isScalar(right))
            smearVec = builder.smearScalar(decorations.precision, right, vecType);

        // do each vector op
        for (unsigned int c = 0; c < numCols; ++c) {
            std::vector<unsigned int> indexes;
            indexes.push_back(c);
            spv::Id  leftVec =  leftMat ? builder.createCompositeExtract( left, vecType, indexes) : smearVec;
            spv::Id rightVec = rightMat ? builder.createCompositeExtract(right, vecType, indexes) : smearVec;
            spv::Id result = builder.createBinOp(op, vecType, leftVec, rightVec);
            decorations.addNoContraction(builder, result);
            decorations.addNonUniform(builder, result);
            results.push_back(builder.setPrecision(result, decorations.precision));
        }

        // put the pieces together
        spv::Id result = builder.setPrecision(builder.createCompositeConstruct(typeId, results), decorations.precision);
        decorations.addNonUniform(builder, result);
        return result;
    }
    default:
        assert(0);
        return spv::NoResult;
    }
}